

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pce.c
# Opt level: O1

void pce_incspr(int *ip)

{
  int iVar1;
  int size;
  int iVar2;
  int iVar3;
  int h;
  int w;
  int y;
  int x;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  labldef(loccnt,1);
  if (pass == 1) {
    loadlc(loccnt,0);
  }
  iVar1 = pcx_get_args(ip);
  if (iVar1 != 0) {
    iVar1 = pcx_parse_args(0,pcx_nb_args,&local_34,&local_38,&local_3c,&local_40,0x10);
    if (iVar1 != 0) {
      if (0 < local_40) {
        iVar1 = 0;
        do {
          if (0 < local_3c) {
            iVar2 = 0;
            iVar3 = 0;
            do {
              size = pcx_pack_16x16_sprite(buffer,local_34 + iVar2,local_38 + iVar1 * 0x10);
              putbuffer(buffer,size);
              iVar3 = iVar3 + 1;
              iVar2 = iVar2 + 0x10;
            } while (iVar3 < local_3c);
          }
          iVar1 = iVar1 + 1;
        } while (iVar1 < local_40);
      }
      if (pass == 1) {
        println();
      }
    }
  }
  return;
}

Assistant:

void
pce_incspr(int *ip)
{
	int i, j;
	int x, y, w, h;
	int sx, sy;
	int size;

	/* define label */
	labldef(loccnt, 1);

	/* output */
	if (pass == LAST_PASS)
		loadlc(loccnt, 0);

	/* get args */
	if (!pcx_get_args(ip))
		return;
	if (!pcx_parse_args(0, pcx_nb_args, &x, &y, &w, &h, 16))
		return;

	/* pack sprites */
	for (i = 0; i < h; i++) {
		for (j = 0; j < w; j++) {
			/* sprite coordinates */
			sx = x + (j << 4);
			sy = y + (i << 4);

			/* encode sprite */
			size = pcx_pack_16x16_sprite(buffer, sx, sy);

			/* store sprite */
			putbuffer(buffer, size);
		}
	}

	/* output */
	if (pass == LAST_PASS)
		println();
}